

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

float __thiscall
notch::core::SoftmaxWithLoss::output(SoftmaxWithLoss *this,Array *actual,Array *expected)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  float *pfVar5;
  double dVar6;
  ulong local_40;
  size_t i;
  float local_24;
  Array *pAStack_20;
  float lossTotal;
  Array *expected_local;
  Array *actual_local;
  SoftmaxWithLoss *this_local;
  
  local_24 = 0.0;
  sVar3 = this->nSize;
  pAStack_20 = expected;
  expected_local = actual;
  actual_local = (Array *)this;
  sVar4 = std::valarray<float>::size(actual);
  if (sVar3 != sVar4) {
    __assert_fail("nSize == actual.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x7e3,
                  "virtual float notch::SoftmaxWithLoss::output(const Array &, const Array &)");
  }
  sVar3 = this->nSize;
  sVar4 = std::valarray<float>::size(pAStack_20);
  if (sVar3 == sVar4) {
    softmax((SoftmaxWithLoss *)&i,expected_local);
    std::valarray<float>::operator=(&this->softmaxOutput,(valarray<float> *)&i);
    std::valarray<float>::~valarray((valarray<float> *)&i);
    for (local_40 = 0; local_40 < this->nSize; local_40 = local_40 + 1) {
      pfVar5 = std::valarray<float>::operator[](pAStack_20,local_40);
      fVar1 = *pfVar5;
      pfVar5 = std::valarray<float>::operator[](&this->softmaxOutput,local_40);
      dVar6 = std::log((double)(ulong)(uint)*pfVar5);
      local_24 = -fVar1 * SUB84(dVar6,0) + local_24;
      pfVar5 = std::valarray<float>::operator[](pAStack_20,local_40);
      fVar1 = *pfVar5;
      pfVar5 = std::valarray<float>::operator[](&this->softmaxOutput,local_40);
      fVar2 = *pfVar5;
      pfVar5 = std::valarray<float>::operator[](&this->lossGrad,local_40);
      *pfVar5 = fVar1 - fVar2;
    }
    return local_24;
  }
  __assert_fail("nSize == expected.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x7e4,"virtual float notch::SoftmaxWithLoss::output(const Array &, const Array &)")
  ;
}

Assistant:

virtual float output(const Array &actual, const Array &expected) {
        float lossTotal = 0.0;
        assert (nSize == actual.size());
        assert (nSize == expected.size());
        softmaxOutput = softmax(actual);
        for (size_t i = 0; i < nSize; ++i) {
            // accumulate loss across all class labels
            lossTotal -= expected[i] * std::log(softmaxOutput[i]);
            // combination of softmax activation with cross-entropy loss
            // allows to simplify loss gradient calculation:
            //
            // $$ \\grad_y E = d - \\phi(y)$$
            lossGrad[i] = expected[i] - softmaxOutput[i];
        }
        return lossTotal;
    }